

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_test.cpp
# Opt level: O3

void __thiscall bidfx_public_api::price::SubscriptionTest::SubscriptionTest(SubscriptionTest *this)

{
  Subject *this_00;
  BasicUserInfo *pBVar1;
  string *psVar2;
  Tenor *pTVar3;
  undefined8 *puVar4;
  Subscription *pSVar5;
  long *local_210 [2];
  long local_200 [2];
  SubjectFactory local_1f0 [8];
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  long *local_1a8 [2];
  long local_198 [2];
  long *local_188 [2];
  long local_178 [2];
  long *local_168 [2];
  long local_158 [2];
  long *local_148 [2];
  long local_138 [2];
  long *local_128 [2];
  long local_118 [2];
  long *local_108 [2];
  long local_f8 [2];
  long *local_e8 [2];
  long local_d8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  undefined8 local_98;
  code *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  string local_50 [32];
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__SubscriptionTest_0029d4b0;
  this_00 = &this->subject_;
  bidfx_public_api::price::subject::Subject::Subject(this_00);
  pBVar1 = (BasicUserInfo *)operator_new(0xf0);
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"localhost","");
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"lasman","");
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"FX_ACCT","");
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"CPP","");
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"0","");
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"-","");
  bidfx_public_api::BasicUserInfo::BasicUserInfo
            (pBVar1,local_108,local_128,local_148,local_210,local_168,(string *)local_e8);
  this->user_info = (UserInfo *)pBVar1;
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  if (local_168[0] != local_158) {
    operator_delete(local_168[0],local_158[0] + 1);
  }
  if (local_210[0] != local_200) {
    operator_delete(local_210[0],local_200[0] + 1);
  }
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  if (local_128[0] != local_118) {
    operator_delete(local_128[0],local_118[0] + 1);
  }
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0],local_f8[0] + 1);
  }
  bidfx_public_api::price::subject::SubjectFactory::SubjectFactory(local_1f0,this->user_info);
  bidfx_public_api::price::subject::SubjectFactory::Fx();
  local_98 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
  bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Forward();
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"FX_ACCT","");
  psVar2 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::BuySideAccount(local_50);
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"EUR","");
  psVar2 = (string *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar2)
  ;
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"EURUSD","");
  bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar2);
  pTVar3 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity(1000.0);
  psVar2 = (string *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar3);
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"DBFX","");
  puVar4 = (undefined8 *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider(psVar2);
  (**(code **)*puVar4)(&local_b0,puVar4);
  bidfx_public_api::price::subject::Subject::operator=(this_00,(Subject *)&local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0);
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],local_198[0] + 1);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  local_90 = __cxa_throw;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  pSVar5 = (Subscription *)operator_new(0x50);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_c8,this_00);
  bidfx_public_api::price::Subscription::Subscription(pSVar5,&local_c8);
  this->subscription_ = pSVar5;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return;
}

Assistant:

SubscriptionTest()
    {
        user_info = new BasicUserInfo("localhost", "lasman", "FX_ACCT", "CPP", "0", "-");
        subject_ = subject::SubjectFactory(user_info).Fx().Stream().Forward().BuySideAccount("FX_ACCT").Currency("EUR").CurrencyPair("EURUSD").Quantity(1000).Tenor(Tenor::IN_2_MONTHS).LiquidityProvider("DBFX").CreateSubject();
        subscription_ = new Subscription(subject_);
    }